

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O0

bool __thiscall ON_AngleValue::Read(ON_AngleValue *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  AngleUnitSystem AVar2;
  LengthUnitSystem LVar3;
  StringFormat SVar4;
  uint local_34;
  uint local_30;
  uint u;
  uint context_length_unit_system_as_unsigned;
  uint angle_unit_system_as_unsigned;
  bool rc;
  ON_BinaryArchive *pOStack_20;
  int content_version;
  ON_BinaryArchive *archive_local;
  ON_AngleValue *this_local;
  
  pOStack_20 = archive;
  archive_local = (ON_BinaryArchive *)this;
  operator=(this,&Unset);
  angle_unit_system_as_unsigned = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmAnonymousChunk
                    (pOStack_20,(int *)&angle_unit_system_as_unsigned);
  if (!bVar1) {
    return false;
  }
  context_length_unit_system_as_unsigned._3_1_ = 0;
  bVar1 = ON_BinaryArchive::ReadDouble(pOStack_20,&this->m_angle);
  if (bVar1) {
    u = (uint)this->m_angle_unit_system;
    bVar1 = ON_BinaryArchive::ReadInt(pOStack_20,&u);
    if (bVar1) {
      AVar2 = ON::AngleUnitSystemFromUnsigned(u);
      this->m_angle_unit_system = AVar2;
      local_30 = (uint)this->m_context_length_unit_system;
      bVar1 = ON_BinaryArchive::ReadInt(pOStack_20,&local_30);
      if (bVar1) {
        LVar3 = ON::LengthUnitSystemFromUnsigned(local_30);
        this->m_context_length_unit_system = LVar3;
        if (this->m_context_length_unit_system == Unset) {
          this->m_context_length_unit_system = None;
        }
        bVar1 = ON_BinaryArchive::ReadInt(pOStack_20,&this->m_context_locale_id);
        if ((bVar1) &&
           (bVar1 = ON_BinaryArchive::ReadString(pOStack_20,&this->m_angle_as_string), bVar1)) {
          if (0 < (int)angle_unit_system_as_unsigned) {
            local_34 = (uint)this->m_string_format;
            bVar1 = ON_BinaryArchive::ReadInt(pOStack_20,&local_34);
            if (!bVar1) goto LAB_00860123;
            SVar4 = AngleStringFormatFromUnsigned(local_34);
            this->m_string_format = SVar4;
          }
          context_length_unit_system_as_unsigned._3_1_ = 1;
        }
      }
    }
  }
LAB_00860123:
  bVar1 = ON_BinaryArchive::EndRead3dmChunk(pOStack_20);
  if (!bVar1) {
    context_length_unit_system_as_unsigned._3_1_ = 0;
  }
  return (bool)(context_length_unit_system_as_unsigned._3_1_ & 1);
}

Assistant:

bool ON_AngleValue::Read(
  class ON_BinaryArchive& archive
)
{
  *this = ON_AngleValue::Unset;
  int content_version = 0;
  if (!archive.BeginRead3dmAnonymousChunk(&content_version))
    return false;

  bool rc = false;
  for (;;)
  {
    if (!archive.ReadDouble(&m_angle))
      break;
    unsigned int angle_unit_system_as_unsigned = static_cast<unsigned int>(m_angle_unit_system);
    if (!archive.ReadInt(&angle_unit_system_as_unsigned))
      break;
    m_angle_unit_system = ON::AngleUnitSystemFromUnsigned(angle_unit_system_as_unsigned);

    unsigned int context_length_unit_system_as_unsigned = static_cast<unsigned int>(m_context_length_unit_system);
    if (!archive.ReadInt(&context_length_unit_system_as_unsigned))
      break;
    m_context_length_unit_system = ON::LengthUnitSystemFromUnsigned(context_length_unit_system_as_unsigned);
    if (ON::LengthUnitSystem::Unset == m_context_length_unit_system)
      m_context_length_unit_system = ON::LengthUnitSystem::None;
    if (!archive.ReadInt(&m_context_locale_id))
      break;

    if (!archive.ReadString(m_angle_as_string))
      break;

    if (content_version >= 1)
    {
      // content version 1 added m_string_format
      unsigned int u = static_cast<unsigned char>(m_string_format);
      if (!archive.ReadInt(&u))
        break;
      m_string_format = ON_AngleValue::AngleStringFormatFromUnsigned(u);
    }


    rc = true;
    break;
  }
  if (!archive.EndRead3dmChunk())
    rc = false;
  return rc;
}